

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordering.h
# Opt level: O0

Expression *
wasm::getResultOfFirst
          (Expression *first,Expression *second,Function *func,Module *wasm,PassOptions *passOptions
          )

{
  bool bVar1;
  Drop *left;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  optional<wasm::Type> local_d0;
  uintptr_t local_c0;
  LocalSet *local_b8;
  Expression *local_b0;
  LocalGet *local_a8;
  initializer_list<wasm::Expression_*> local_a0;
  uintptr_t local_90;
  Index local_84;
  Type TStack_80;
  Index index;
  Type type;
  optional<wasm::Type> local_70;
  optional<wasm::Type> local_58;
  BasicType local_44;
  Builder local_40;
  Builder builder;
  PassOptions *passOptions_local;
  Module *wasm_local;
  Function *func_local;
  Expression *second_local;
  Expression *first_local;
  
  builder.wasm = (Module *)passOptions;
  bVar1 = Type::isConcrete(&first->type);
  if (!bVar1) {
    __assert_fail("first->type.isConcrete()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ordering.h"
                  ,0x2f,
                  "Expression *wasm::getResultOfFirst(Expression *, Expression *, Function *, Module *, const PassOptions &)"
                 );
  }
  Builder::Builder(&local_40,wasm);
  local_44 = unreachable;
  bVar1 = Type::operator==(&second->type,&local_44);
  if (bVar1) {
    left = Builder::makeDrop(&local_40,first);
    std::optional<wasm::Type>::optional(&local_58);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    first_local = (Expression *)Builder::makeSequence(&local_40,(Expression *)left,second,type_00);
  }
  else {
    bVar1 = EffectAnalyzer::canReorder((PassOptions *)builder.wasm,wasm,first,second);
    if (bVar1) {
      std::optional<wasm::Type>::optional(&local_70);
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      first_local = (Expression *)Builder::makeSequence(&local_40,second,first,type_01);
    }
    else {
      local_90 = (first->type).id;
      TStack_80.id = local_90;
      local_84 = Builder::addVar(func,(Type)local_90);
      local_b8 = Builder::makeLocalSet(&local_40,local_84,first);
      local_c0 = TStack_80.id;
      local_b0 = second;
      local_a8 = Builder::makeLocalGet(&local_40,local_84,TStack_80);
      local_a0._M_array = (iterator)&local_b8;
      local_a0._M_len = 3;
      std::optional<wasm::Type>::optional(&local_d0);
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_d0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_d0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      first_local = (Expression *)Builder::makeBlock(&local_40,&local_a0,type_02);
    }
  }
  return first_local;
}

Assistant:

inline Expression* getResultOfFirst(Expression* first,
                                    Expression* second,
                                    Function* func,
                                    Module* wasm,
                                    const PassOptions& passOptions) {
  assert(first->type.isConcrete());

  Builder builder(*wasm);

  if (second->type == Type::unreachable) {
    // No value is actually consumed here. Emit something with unreachable type.
    // (Note that if we continued to the canReorder code after us, and emitted
    // second followed by first, then the block would have a concrete type due
    // to the last element having such a type - which would not have unreachable
    // type.)
    return builder.makeSequence(builder.makeDrop(first), second);
  }

  if (EffectAnalyzer::canReorder(passOptions, *wasm, first, second)) {
    return builder.makeSequence(second, first);
  }

  auto type = first->type;
  auto index = Builder::addVar(func, type);
  return builder.makeBlock({builder.makeLocalSet(index, first),
                            second,
                            builder.makeLocalGet(index, type)});
}